

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Status json_object_grow_and_rehash(JSON_Object *object)

{
  JSON_Value *value;
  bool bVar1;
  JSON_Status JVar2;
  size_t *psVar3;
  char **ppcVar4;
  JSON_Value **ppJVar5;
  size_t *psVar6;
  unsigned_long *puVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  JSON_Object *pJVar12;
  JSON_Value *pJVar13;
  byte bVar14;
  JSON_Object local_78;
  
  bVar14 = 0;
  uVar8 = object->cell_capacity * 2;
  uVar11 = 0x10;
  if (0x10 < uVar8) {
    uVar11 = uVar8;
  }
  local_78.count = 0;
  uVar8 = (uVar11 * 7) / 10 & 0xffffffff;
  local_78.item_capacity = uVar8;
  local_78.cell_capacity = uVar11;
  psVar3 = (size_t *)(*parson_malloc)(uVar11 * 8);
  sVar10 = uVar8 << 3;
  local_78.cells = psVar3;
  ppcVar4 = (char **)(*parson_malloc)(sVar10);
  local_78.names = ppcVar4;
  ppJVar5 = (JSON_Value **)(*parson_malloc)(sVar10);
  local_78.values = ppJVar5;
  psVar6 = (size_t *)(*parson_malloc)(sVar10);
  local_78.cell_ixs = psVar6;
  puVar7 = (unsigned_long *)(*parson_malloc)(sVar10);
  local_78.hashes = puVar7;
  if ((((psVar3 == (size_t *)0x0) || (ppcVar4 == (char **)0x0)) || (ppJVar5 == (JSON_Value **)0x0))
     || (puVar7 == (unsigned_long *)0x0 || psVar6 == (size_t *)0x0)) {
    (*parson_free)(psVar3);
    (*parson_free)(ppcVar4);
    (*parson_free)(ppJVar5);
    (*parson_free)(psVar6);
    (*parson_free)(puVar7);
LAB_0017a669:
    JVar2 = -1;
  }
  else {
    uVar8 = 0;
    do {
      psVar3[uVar8] = 0xffffffffffffffff;
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) < uVar11);
    if (object == (JSON_Object *)0x0) {
      pJVar13 = (JSON_Value *)0x0;
    }
    else {
      pJVar13 = object->wrapping_value;
    }
    local_78.wrapping_value = pJVar13;
    if (object->count != 0) {
      uVar8 = 0;
      uVar11 = 1;
      do {
        value = object->values[uVar8];
        JVar2 = json_object_add(&local_78,object->names[uVar8],value);
        if (JVar2 != 0) {
          json_object_deinit(&local_78,0,0);
          goto LAB_0017a669;
        }
        value->parent = pJVar13;
        bVar1 = uVar11 < object->count;
        uVar8 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar1);
    }
    JVar2 = 0;
    json_object_deinit(object,0,0);
    pJVar12 = &local_78;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      object->wrapping_value = pJVar12->wrapping_value;
      pJVar12 = (JSON_Object *)((long)pJVar12 + ((ulong)bVar14 * -2 + 1) * 8);
      object = (JSON_Object *)((long)object + (ulong)bVar14 * -0x10 + 8);
    }
  }
  return JVar2;
}

Assistant:

static JSON_Status json_object_grow_and_rehash(JSON_Object *object) {
    JSON_Value *wrapping_value = NULL;
    JSON_Object new_object;
    char *key = NULL;
    JSON_Value *value = NULL;
    unsigned int i = 0;
    size_t new_capacity = MAX(object->cell_capacity * 2, STARTING_CAPACITY);
    JSON_Status res = json_object_init(&new_object, new_capacity);
    if (res != JSONSuccess) {
        return JSONFailure;
    }

    wrapping_value = json_object_get_wrapping_value(object);
    new_object.wrapping_value = wrapping_value;

    for (i = 0; i < object->count; i++) {
        key = object->names[i];
        value = object->values[i];
        res = json_object_add(&new_object, key, value);
        if (res != JSONSuccess) {
            json_object_deinit(&new_object, PARSON_FALSE, PARSON_FALSE);
            return JSONFailure;
        }
        value->parent = wrapping_value;
    }
    json_object_deinit(object, PARSON_FALSE, PARSON_FALSE);
    *object = new_object;
    return JSONSuccess;
}